

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void ARGBColorMatrixRow_SSSE3(uint8_t *src_argb,uint8_t *dst_argb,int8_t *matrix_argb,int width)

{
  bool bVar1;
  char cVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined1 auVar24 [14];
  undefined1 auVar25 [12];
  unkbyte10 Var26;
  undefined1 auVar27 [14];
  undefined1 auVar28 [12];
  unkbyte10 Var29;
  unkbyte9 Var30;
  unkbyte9 Var31;
  undefined6 uVar32;
  undefined2 uVar33;
  undefined6 uVar34;
  undefined4 uVar35;
  undefined2 uVar36;
  int iVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  
  uVar20 = *(undefined4 *)matrix_argb;
  uVar21 = *(undefined4 *)(matrix_argb + 4);
  uVar22 = *(undefined4 *)(matrix_argb + 8);
  uVar23 = *(undefined4 *)(matrix_argb + 0xc);
  auVar45._4_4_ = uVar23;
  auVar45._0_4_ = uVar23;
  auVar45._8_4_ = uVar23;
  auVar45._12_4_ = uVar23;
  do {
    auVar38._4_4_ = uVar20;
    auVar38._0_4_ = uVar20;
    auVar38._8_4_ = uVar20;
    auVar38._12_4_ = uVar20;
    auVar38 = pmaddubsw(*(undefined1 (*) [16])src_argb,auVar38);
    auVar44._4_4_ = uVar20;
    auVar44._0_4_ = uVar20;
    auVar44._8_4_ = uVar20;
    auVar44._12_4_ = uVar20;
    auVar47 = pmaddubsw(*(undefined1 (*) [16])((long)src_argb + 0x10),auVar44);
    auVar46._4_4_ = uVar21;
    auVar46._0_4_ = uVar21;
    auVar46._8_4_ = uVar21;
    auVar46._12_4_ = uVar21;
    auVar46 = pmaddubsw(*(undefined1 (*) [16])src_argb,auVar46);
    auVar18._4_4_ = uVar21;
    auVar18._0_4_ = uVar21;
    auVar18._8_4_ = uVar21;
    auVar18._12_4_ = uVar21;
    auVar44 = pmaddubsw(*(undefined1 (*) [16])((long)src_argb + 0x10),auVar18);
    auVar38 = phaddsw(auVar38,auVar47);
    auVar44 = phaddsw(auVar46,auVar44);
    auVar38 = psraw(auVar38,6);
    auVar44 = psraw(auVar44,6);
    sVar3 = auVar38._0_2_;
    sVar4 = auVar38._2_2_;
    sVar6 = auVar38._4_2_;
    sVar8 = auVar38._6_2_;
    sVar10 = auVar38._8_2_;
    sVar12 = auVar38._10_2_;
    sVar14 = auVar38._12_2_;
    sVar16 = auVar38._14_2_;
    cVar2 = (0 < sVar16) * (sVar16 < 0x100) * auVar38[0xe] - (0xff < sVar16);
    sVar16 = auVar44._0_2_;
    sVar5 = auVar44._2_2_;
    sVar7 = auVar44._4_2_;
    sVar9 = auVar44._6_2_;
    sVar11 = auVar44._8_2_;
    sVar13 = auVar44._10_2_;
    sVar15 = auVar44._12_2_;
    sVar17 = auVar44._14_2_;
    uVar33 = CONCAT11((0 < sVar17) * (sVar17 < 0x100) * auVar44[0xe] - (0xff < sVar17),cVar2);
    uVar23 = CONCAT31(CONCAT21(uVar33,(0 < sVar15) * (sVar15 < 0x100) * auVar44[0xc] -
                                      (0xff < sVar15)),
                      (0 < sVar14) * (sVar14 < 0x100) * auVar38[0xc] - (0xff < sVar14));
    uVar32 = CONCAT51(CONCAT41(uVar23,(0 < sVar13) * (sVar13 < 0x100) * auVar44[10] -
                                      (0xff < sVar13)),
                      (0 < sVar12) * (sVar12 < 0x100) * auVar38[10] - (0xff < sVar12));
    Var30 = CONCAT72(CONCAT61(uVar32,(0 < sVar11) * (sVar11 < 0x100) * auVar44[8] - (0xff < sVar11))
                     ,CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar38[8] - (0xff < sVar10),cVar2)
                    );
    Var26 = CONCAT91(CONCAT81((long)((unkuint9)Var30 >> 8),
                              (0 < sVar9) * (sVar9 < 0x100) * auVar44[6] - (0xff < sVar9)),
                     (0 < sVar8) * (sVar8 < 0x100) * auVar38[6] - (0xff < sVar8));
    auVar25._2_10_ = Var26;
    auVar25[1] = (0 < sVar7) * (sVar7 < 0x100) * auVar44[4] - (0xff < sVar7);
    auVar25[0] = (0 < sVar6) * (sVar6 < 0x100) * auVar38[4] - (0xff < sVar6);
    auVar24._2_12_ = auVar25;
    auVar24[1] = (0 < sVar5) * (sVar5 < 0x100) * auVar44[2] - (0xff < sVar5);
    auVar24[0] = (0 < sVar4) * (sVar4 < 0x100) * auVar38[2] - (0xff < sVar4);
    auVar39._0_2_ =
         CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar44[0] - (0xff < sVar16),
                  (0 < sVar3) * (sVar3 < 0x100) * auVar38[0] - (0xff < sVar3));
    auVar39._2_14_ = auVar24;
    auVar47._4_4_ = uVar22;
    auVar47._0_4_ = uVar22;
    auVar47._8_4_ = uVar22;
    auVar47._12_4_ = uVar22;
    auVar38 = pmaddubsw(*(undefined1 (*) [16])src_argb,auVar47);
    auVar19._4_4_ = uVar22;
    auVar19._0_4_ = uVar22;
    auVar19._8_4_ = uVar22;
    auVar19._12_4_ = uVar22;
    auVar44 = pmaddubsw(*(undefined1 (*) [16])((long)src_argb + 0x10),auVar19);
    auVar38 = phaddsw(auVar38,auVar44);
    auVar44 = pmaddubsw(*(undefined1 (*) [16])src_argb,auVar45);
    auVar46 = pmaddubsw(*(undefined1 (*) [16])((long)src_argb + 0x10),auVar45);
    auVar44 = phaddsw(auVar44,auVar46);
    auVar38 = psraw(auVar38,6);
    auVar44 = psraw(auVar44,6);
    sVar3 = auVar38._0_2_;
    sVar4 = auVar38._2_2_;
    sVar6 = auVar38._4_2_;
    sVar8 = auVar38._6_2_;
    sVar10 = auVar38._8_2_;
    sVar12 = auVar38._10_2_;
    sVar14 = auVar38._12_2_;
    sVar16 = auVar38._14_2_;
    cVar2 = (0 < sVar16) * (sVar16 < 0x100) * auVar38[0xe] - (0xff < sVar16);
    sVar16 = auVar44._0_2_;
    sVar5 = auVar44._2_2_;
    sVar7 = auVar44._4_2_;
    sVar9 = auVar44._6_2_;
    sVar11 = auVar44._8_2_;
    sVar13 = auVar44._10_2_;
    sVar15 = auVar44._12_2_;
    sVar17 = auVar44._14_2_;
    uVar36 = CONCAT11((0 < sVar17) * (sVar17 < 0x100) * auVar44[0xe] - (0xff < sVar17),cVar2);
    uVar35 = CONCAT31(CONCAT21(uVar36,(0 < sVar15) * (sVar15 < 0x100) * auVar44[0xc] -
                                      (0xff < sVar15)),
                      (0 < sVar14) * (sVar14 < 0x100) * auVar38[0xc] - (0xff < sVar14));
    uVar34 = CONCAT51(CONCAT41(uVar35,(0 < sVar13) * (sVar13 < 0x100) * auVar44[10] -
                                      (0xff < sVar13)),
                      (0 < sVar12) * (sVar12 < 0x100) * auVar38[10] - (0xff < sVar12));
    Var31 = CONCAT72(CONCAT61(uVar34,(0 < sVar11) * (sVar11 < 0x100) * auVar44[8] - (0xff < sVar11))
                     ,CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar38[8] - (0xff < sVar10),cVar2)
                    );
    Var29 = CONCAT91(CONCAT81((long)((unkuint9)Var31 >> 8),
                              (0 < sVar9) * (sVar9 < 0x100) * auVar44[6] - (0xff < sVar9)),
                     (0 < sVar8) * (sVar8 < 0x100) * auVar38[6] - (0xff < sVar8));
    auVar28._2_10_ = Var29;
    auVar28[1] = (0 < sVar7) * (sVar7 < 0x100) * auVar44[4] - (0xff < sVar7);
    auVar28[0] = (0 < sVar6) * (sVar6 < 0x100) * auVar38[4] - (0xff < sVar6);
    auVar27._2_12_ = auVar28;
    auVar27[1] = (0 < sVar5) * (sVar5 < 0x100) * auVar44[2] - (0xff < sVar5);
    auVar27[0] = (0 < sVar4) * (sVar4 < 0x100) * auVar38[2] - (0xff < sVar4);
    auVar40[3] = (0 < sVar16) * (sVar16 < 0x100) * auVar44[0] - (0xff < sVar16);
    auVar40[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar38[0] - (0xff < sVar3);
    auVar43._0_12_ = auVar39._0_12_;
    auVar43._12_2_ = (short)Var26;
    auVar43._14_2_ = (short)Var29;
    auVar42._12_4_ = auVar43._12_4_;
    auVar42._0_10_ = auVar39._0_10_;
    auVar42._10_2_ = auVar28._0_2_;
    auVar41._10_6_ = auVar42._10_6_;
    auVar41._0_8_ = auVar39._0_8_;
    auVar41._8_2_ = auVar25._0_2_;
    auVar40._8_8_ = auVar41._8_8_;
    auVar40._6_2_ = auVar27._0_2_;
    auVar40._4_2_ = auVar24._0_2_;
    auVar40._0_2_ = auVar39._0_2_;
    *(undefined1 (*) [16])dst_argb = auVar40;
    *(short *)*(undefined1 (*) [16])((long)dst_argb + 0x10) = (short)((unkuint9)Var30 >> 8);
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 2) = (short)((unkuint9)Var31 >> 8);
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 4) = (short)uVar32;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 6) = (short)uVar34;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 8) = (short)uVar23;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 10) = (short)uVar35;
    *(undefined2 *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 0xc) = uVar33;
    *(undefined2 *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 0xe) = uVar36;
    src_argb = (uint8_t *)((long)src_argb + 0x20);
    dst_argb = (uint8_t *)((long)dst_argb + 0x20);
    iVar37 = width + -8;
    bVar1 = 7 < width;
    width = iVar37;
  } while (iVar37 != 0 && bVar1);
  return;
}

Assistant:

void ARGBColorMatrixRow_SSSE3(const uint8_t* src_argb,
                              uint8_t* dst_argb,
                              const int8_t* matrix_argb,
                              int width) {
  asm volatile(
      "movdqu      (%3),%%xmm5                   \n"
      "pshufd      $0x00,%%xmm5,%%xmm2           \n"
      "pshufd      $0x55,%%xmm5,%%xmm3           \n"
      "pshufd      $0xaa,%%xmm5,%%xmm4           \n"
      "pshufd      $0xff,%%xmm5,%%xmm5           \n"

      // 8 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm7               \n"
      "pmaddubsw   %%xmm2,%%xmm0                 \n"
      "pmaddubsw   %%xmm2,%%xmm7                 \n"
      "movdqu      (%0),%%xmm6                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "pmaddubsw   %%xmm3,%%xmm6                 \n"
      "pmaddubsw   %%xmm3,%%xmm1                 \n"
      "phaddsw     %%xmm7,%%xmm0                 \n"
      "phaddsw     %%xmm1,%%xmm6                 \n"
      "psraw       $0x6,%%xmm0                   \n"
      "psraw       $0x6,%%xmm6                   \n"
      "packuswb    %%xmm0,%%xmm0                 \n"
      "packuswb    %%xmm6,%%xmm6                 \n"
      "punpcklbw   %%xmm6,%%xmm0                 \n"
      "movdqu      (%0),%%xmm1                   \n"
      "movdqu      0x10(%0),%%xmm7               \n"
      "pmaddubsw   %%xmm4,%%xmm1                 \n"
      "pmaddubsw   %%xmm4,%%xmm7                 \n"
      "phaddsw     %%xmm7,%%xmm1                 \n"
      "movdqu      (%0),%%xmm6                   \n"
      "movdqu      0x10(%0),%%xmm7               \n"
      "pmaddubsw   %%xmm5,%%xmm6                 \n"
      "pmaddubsw   %%xmm5,%%xmm7                 \n"
      "phaddsw     %%xmm7,%%xmm6                 \n"
      "psraw       $0x6,%%xmm1                   \n"
      "psraw       $0x6,%%xmm6                   \n"
      "packuswb    %%xmm1,%%xmm1                 \n"
      "packuswb    %%xmm6,%%xmm6                 \n"
      "punpcklbw   %%xmm6,%%xmm1                 \n"
      "movdqa      %%xmm0,%%xmm6                 \n"
      "punpcklwd   %%xmm1,%%xmm0                 \n"
      "punpckhwd   %%xmm1,%%xmm6                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "movdqu      %%xmm6,0x10(%1)               \n"
      "lea         0x20(%0),%0                   \n"
      "lea         0x20(%1),%1                   \n"
      "sub         $0x8,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src_argb),   // %0
        "+r"(dst_argb),   // %1
        "+r"(width)       // %2
      : "r"(matrix_argb)  // %3
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6",
        "xmm7");
}